

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_lifetime.h
# Opt level: O0

void __thiscall
validation_layer::HandleLifetimeValidation::addHandle
          (HandleLifetimeValidation *this,zet_tracer_exp_handle_t handle)

{
  value_type *__x;
  void *local_30;
  pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>
  local_28;
  zet_tracer_exp_handle_t local_18;
  zet_tracer_exp_handle_t handle_local;
  HandleLifetimeValidation *this_local;
  
  local_30 = (void *)0x0;
  local_18 = handle;
  handle_local = (zet_tracer_exp_handle_t)this;
  std::
  pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>
  ::pair<_zet_tracer_exp_handle_t_*&,_std::nullptr_t,_true>(&local_28,&local_18,&local_30);
  std::
  unordered_map<_zet_tracer_exp_handle_t_*,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>,_std::hash<_zet_tracer_exp_handle_t_*>,_std::equal_to<_zet_tracer_exp_handle_t_*>,_std::allocator<std::pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>_>
  ::insert((pair<std::__detail::_Node_iterator<std::pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false,_false>,_bool>
            *)&this->tracerExpHandleStateMap,
           (unordered_map<_zet_tracer_exp_handle_t_*,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>,_std::hash<_zet_tracer_exp_handle_t_*>,_std::equal_to<_zet_tracer_exp_handle_t_*>,_std::allocator<std::pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>_>
            *)&local_28,__x);
  std::
  pair<_zet_tracer_exp_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>
  ::~pair(&local_28);
  return;
}

Assistant:

void addHandle(zet_tracer_exp_handle_t handle) {
    tracerExpHandleStateMap.insert({handle, nullptr});
  }